

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::EncodeOrDecode
          (CommandLineInterface *this,DescriptorPool *pool)

{
  bool bVar1;
  uint uVar2;
  Descriptor *pDVar3;
  ostream *poVar4;
  Message *pMVar5;
  pointer pMVar6;
  long in_RDI;
  Parser parser;
  ErrorPrinter error_collector;
  FileOutputStream out;
  FileInputStream in;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_> message;
  DynamicMessageFactory dynamic_factory;
  Descriptor *type;
  ZeroCopyInputStream *in_stack_fffffffffffffdc8;
  FileInputStream *in_stack_fffffffffffffdd0;
  DiskSourceTree *in_stack_fffffffffffffde0;
  DescriptorPool *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  DynamicMessageFactory *in_stack_fffffffffffffe00;
  ErrorCollector *local_1d0;
  string local_1a8 [16];
  ZeroCopyOutputStream *in_stack_fffffffffffffe68;
  Message *in_stack_fffffffffffffe70;
  ZeroCopyOutputStream *in_stack_fffffffffffffea0;
  MessageLite *in_stack_fffffffffffffea8;
  ErrorCollector aEStack_150 [18];
  Message *in_stack_ffffffffffffff40;
  ZeroCopyInputStream *in_stack_ffffffffffffff48;
  Parser *in_stack_ffffffffffffff50;
  byte local_1;
  
  pDVar3 = DescriptorPool::FindMessageTypeByName
                     ((DescriptorPool *)
                      CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                      (string *)in_stack_fffffffffffffde8);
  if (pDVar3 == (Descriptor *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Type not defined: ");
    poVar4 = std::operator<<(poVar4,(string *)(in_RDI + 0x200));
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_1 = 0;
    goto LAB_00416867;
  }
  DynamicMessageFactory::DynamicMessageFactory
            ((DynamicMessageFactory *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
             in_stack_fffffffffffffde8);
  pMVar5 = DynamicMessageFactory::GetPrototype
                     ((DynamicMessageFactory *)
                      CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                      (Descriptor *)in_stack_fffffffffffffde8);
  (*(pMVar5->super_MessageLite)._vptr_MessageLite[3])();
  std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>::
  unique_ptr<std::default_delete<google::protobuf::Message>,void>
            ((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
              *)in_stack_fffffffffffffdd0,(pointer)in_stack_fffffffffffffdc8);
  if (*(int *)(in_RDI + 0x150) == 1) {
    anon_unknown_4::SetFdToTextMode(0);
    anon_unknown_4::SetFdToBinaryMode(1);
  }
  else {
    anon_unknown_4::SetFdToBinaryMode(0);
    anon_unknown_4::SetFdToTextMode(1);
  }
  io::FileInputStream::FileInputStream
            ((FileInputStream *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
             (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),(int)in_stack_fffffffffffffde8);
  io::FileOutputStream::FileOutputStream
            ((FileOutputStream *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
             (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),(int)in_stack_fffffffffffffde8);
  if (*(int *)(in_RDI + 0x150) == 1) {
    ErrorPrinter::ErrorPrinter
              ((ErrorPrinter *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
               (ErrorFormat)((ulong)in_stack_fffffffffffffde8 >> 0x20),in_stack_fffffffffffffde0);
    TextFormat::Parser::Parser((Parser *)in_stack_fffffffffffffdd0);
    local_1d0 = (ErrorCollector *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x158) {
      local_1d0 = aEStack_150;
    }
    TextFormat::Parser::RecordErrorsTo((Parser *)&stack0xfffffffffffffe80,local_1d0);
    TextFormat::Parser::AllowPartialMessage((Parser *)&stack0xfffffffffffffe80,true);
    std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::get
              ((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                *)in_stack_fffffffffffffdd0);
    bVar1 = TextFormat::Parser::Parse
                      (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40
                      );
    if (!bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to parse input.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      local_1 = 0;
    }
    TextFormat::Parser::~Parser((Parser *)&stack0xfffffffffffffe80);
    ErrorPrinter::~ErrorPrinter((ErrorPrinter *)in_stack_fffffffffffffdd0);
    if (bVar1) {
LAB_0041661e:
      pMVar6 = std::
               unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
               ::operator->((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                             *)0x41662b);
      uVar2 = (*(pMVar6->super_MessageLite)._vptr_MessageLite[8])();
      if ((uVar2 & 1) == 0) {
        in_stack_fffffffffffffe00 =
             (DynamicMessageFactory *)
             std::operator<<((ostream *)&std::cerr,
                             "warning:  Input message is missing required fields:  ");
        pMVar6 = std::
                 unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                 ::operator->((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                               *)0x416672);
        (*(pMVar6->super_MessageLite)._vptr_MessageLite[9])(local_1a8);
        poVar4 = std::operator<<((ostream *)in_stack_fffffffffffffe00,local_1a8);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_1a8);
      }
      if (*(int *)(in_RDI + 0x150) == 1) {
        std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
        ::operator->((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                      *)0x416707);
        bVar1 = MessageLite::SerializePartialToZeroCopyStream
                          (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
        if (bVar1) {
LAB_004167e8:
          local_1 = 1;
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cerr,"output: I/O error.");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          local_1 = 0;
        }
      }
      else {
        std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
        ::operator*((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                     *)in_stack_fffffffffffffdd0);
        bVar1 = TextFormat::Print(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        if (bVar1) goto LAB_004167e8;
        in_stack_fffffffffffffdd0 =
             (FileInputStream *)std::operator<<((ostream *)&std::cerr,"output: I/O error.");
        std::ostream::operator<<(in_stack_fffffffffffffdd0,std::endl<char,std::char_traits<char>>);
        local_1 = 0;
      }
    }
  }
  else {
    std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
    operator->((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                *)0x4165b7);
    bVar1 = MessageLite::ParsePartialFromZeroCopyStream
                      ((MessageLite *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    if (bVar1) goto LAB_0041661e;
    poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to parse input.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_1 = 0;
  }
  io::FileOutputStream::~FileOutputStream((FileOutputStream *)in_stack_fffffffffffffdd0);
  io::FileInputStream::~FileInputStream(in_stack_fffffffffffffdd0);
  std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
  ~unique_ptr((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
               *)in_stack_fffffffffffffdd0);
  DynamicMessageFactory::~DynamicMessageFactory(in_stack_fffffffffffffe00);
LAB_00416867:
  return (bool)(local_1 & 1);
}

Assistant:

bool CommandLineInterface::EncodeOrDecode(const DescriptorPool* pool) {
  // Look up the type.
  const Descriptor* type = pool->FindMessageTypeByName(codec_type_);
  if (type == NULL) {
    std::cerr << "Type not defined: " << codec_type_ << std::endl;
    return false;
  }

  DynamicMessageFactory dynamic_factory(pool);
  std::unique_ptr<Message> message(dynamic_factory.GetPrototype(type)->New());

  if (mode_ == MODE_ENCODE) {
    SetFdToTextMode(STDIN_FILENO);
    SetFdToBinaryMode(STDOUT_FILENO);
  } else {
    SetFdToBinaryMode(STDIN_FILENO);
    SetFdToTextMode(STDOUT_FILENO);
  }

  io::FileInputStream in(STDIN_FILENO);
  io::FileOutputStream out(STDOUT_FILENO);

  if (mode_ == MODE_ENCODE) {
    // Input is text.
    ErrorPrinter error_collector(error_format_);
    TextFormat::Parser parser;
    parser.RecordErrorsTo(&error_collector);
    parser.AllowPartialMessage(true);

    if (!parser.Parse(&in, message.get())) {
      std::cerr << "Failed to parse input." << std::endl;
      return false;
    }
  } else {
    // Input is binary.
    if (!message->ParsePartialFromZeroCopyStream(&in)) {
      std::cerr << "Failed to parse input." << std::endl;
      return false;
    }
  }

  if (!message->IsInitialized()) {
    std::cerr << "warning:  Input message is missing required fields:  "
              << message->InitializationErrorString() << std::endl;
  }

  if (mode_ == MODE_ENCODE) {
    // Output is binary.
    if (!message->SerializePartialToZeroCopyStream(&out)) {
      std::cerr << "output: I/O error." << std::endl;
      return false;
    }
  } else {
    // Output is text.
    if (!TextFormat::Print(*message, &out)) {
      std::cerr << "output: I/O error." << std::endl;
      return false;
    }
  }

  return true;
}